

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O1

void __thiscall
HashtableAllTest_Swap_Test<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Swap_Test<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *this_00;
  sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_01;
  undefined8 uVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  const_iterator cVar5;
  const_iterator cVar6;
  const_nonempty_iterator piVar7;
  undefined8 uVar8;
  pointer psVar9;
  pointer psVar10;
  pointer psVar11;
  undefined8 uVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  int i;
  int iVar17;
  pointer piVar18;
  float fVar19;
  pair<unsigned_long,_unsigned_long> pVar20;
  Settings __tmp;
  pair<google::sparse_hashtable_const_iterator<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
  r_2;
  pair<google::sparse_hashtable_const_iterator<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
  r;
  size_type expected_buckets;
  TypeParam other_ht;
  hasher hasher;
  KeyInfo __tmp_1;
  SetKey local_299;
  pair<google::sparse_hashtable_const_iterator<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
  local_298;
  undefined1 local_248 [16];
  const_iterator cStack_238;
  const_iterator local_230;
  sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *psStack_228;
  undefined8 local_220;
  const_iterator cStack_218;
  const_iterator local_210;
  const_nonempty_iterator piStack_208;
  bool local_200;
  undefined7 uStack_1ff;
  vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  local_1f8;
  ulong local_1c0;
  undefined8 uStack_1b8;
  Hasher local_1b0;
  SetKey local_1a1;
  undefined1 local_1a0 [16];
  const_iterator cStack_190;
  const_iterator local_188;
  const_nonempty_iterator piStack_180;
  undefined8 local_178;
  const_iterator cStack_170;
  const_iterator local_168;
  undefined8 uStack_160;
  bool local_158;
  undefined7 uStack_157;
  vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  local_150;
  ulong local_118;
  undefined8 uStack_110;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_108;
  Hasher local_fc;
  undefined **local_f0;
  sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_e8;
  Hasher local_54 [3];
  
  local_54[0].id_ = 1;
  local_54[0].num_hashes_ = 0;
  local_54[0].num_compares_ = 0;
  local_1a0._0_8_ = local_1a0._0_8_ & 0xffffffff00000000;
  local_1a0._8_8_ =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  local_f0 = &PTR__BaseHashtableInterface_00c22f88;
  google::
  sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable(&local_e8,200,local_54,local_54,(Identity *)local_248,(SetKey *)&local_298,
                     (Alloc<int,_unsigned_long,_18446744073709551615UL> *)local_1a0);
  local_f0 = &PTR__BaseHashtableInterface_00c22f08;
  iVar13 = UniqueObjectHelper<int>(1);
  this_00 = &(this->
             super_HashtableAllTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ).
             super_HashtableTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_.
             super_BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_;
  google::
  sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(&this_00->rep);
  *(bool *)((long)&(this->
                   super_HashtableAllTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.settings + 0x2a) = true;
  *(int *)((long)&(this->
                  super_HashtableAllTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  ).
                  super_HashtableTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  .ht_.
                  super_BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  .ht_.rep.key_info + 0xc) = iVar13;
  iVar13 = UniqueObjectHelper<int>(2);
  google::
  sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(&local_e8);
  local_e8.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.use_deleted_ = true;
  iVar17 = 3;
  local_e8.key_info.delkey = iVar13;
  do {
    iVar13 = UniqueObjectHelper<int>(iVar17);
    local_248._0_4_ = iVar13;
    google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::insert((pair<google::sparse_hashtable_const_iterator<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
              *)local_1a0,this_00,(value_type *)local_248);
    iVar17 = iVar17 + 1;
  } while (iVar17 != 2000);
  iVar13 = UniqueObjectHelper<int>(1000);
  local_1a0._0_4_ = iVar13;
  google::
  sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::erase(&this_00->rep,(key_type *)local_1a0);
  iVar13 = UniqueObjectHelper<int>(0x7d1);
  local_248._0_4_ = iVar13;
  google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::
  insert((pair<google::sparse_hashtable_const_iterator<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
          *)local_1a0,
         (sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *
         )&local_e8,(value_type *)local_248);
  local_108 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_e8.table.settings.table_size;
  google::
  sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::swap(&this_00->rep,&local_e8);
  local_248._0_4_ = UniqueObjectHelper<int>(2);
  local_298.first.ht =
       (sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_298.first.ht._4_4_,
                   *(type *)((long)&(this->
                                    super_HashtableAllTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                    ).
                                    super_HashtableTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                    .ht_.
                                    super_BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                    .ht_.rep.key_info + 0xc));
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1a0,"this->UniqueKey(2)","this->ht_.deleted_key()",(int *)local_248,
             (int *)&local_298);
  if (local_1a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        local_1a0._8_8_ ==
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      piVar18 = (pointer)0xafc493;
    }
    else {
      piVar18 = *(pointer *)local_1a0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1db,(char *)piVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_298,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_298);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_248._0_8_ + 8))();
    }
  }
  uVar1 = local_1a0._8_8_;
  if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_1a0._8_8_ !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)*(pointer *)local_1a0._8_8_ !=
        &(((Settings *)(local_1a0._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_1a0._8_8_);
    }
    operator_delete((void *)uVar1);
  }
  iVar13 = UniqueObjectHelper<int>(1);
  local_248._0_4_ = iVar13;
  local_298.first.ht =
       (sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_298.first.ht._4_4_,local_e8.key_info.delkey);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1a0,"this->UniqueKey(1)","other_ht.deleted_key()",(int *)local_248,
             (int *)&local_298);
  if (local_1a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        local_1a0._8_8_ ==
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      piVar18 = (pointer)0xafc493;
    }
    else {
      piVar18 = *(pointer *)local_1a0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1dc,(char *)piVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_298,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_298);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_248._0_8_ + 8))();
    }
  }
  uVar1 = local_1a0._8_8_;
  if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_1a0._8_8_ !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)*(pointer *)local_1a0._8_8_ !=
        &(((Settings *)(local_1a0._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_1a0._8_8_);
    }
    operator_delete((void *)uVar1);
  }
  local_248._0_4_ = 1;
  local_298.first.ht =
       (sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_298.first.ht._4_4_,
                   (this_00->rep).settings.
                   super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher.id_);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1a0,"1","this->ht_.hash_funct().id()",(int *)local_248,
             (int *)&local_298);
  if (local_1a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        local_1a0._8_8_ ==
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      piVar18 = (pointer)0xafc493;
    }
    else {
      piVar18 = *(pointer *)local_1a0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1de,(char *)piVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_298,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_298);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_248._0_8_ + 8))();
    }
  }
  uVar1 = local_1a0._8_8_;
  if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_1a0._8_8_ !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)*(pointer *)local_1a0._8_8_ !=
        &(((Settings *)(local_1a0._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_1a0._8_8_);
    }
    operator_delete((void *)uVar1);
  }
  local_248._0_8_ = local_248._0_8_ & 0xffffffff00000000;
  local_298.first.ht =
       (sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_298.first.ht._4_4_,
                   local_e8.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
                   super_Hasher.id_);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1a0,"0","other_ht.hash_funct().id()",(int *)local_248,
             (int *)&local_298);
  if (local_1a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        local_1a0._8_8_ ==
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      piVar18 = (pointer)0xafc493;
    }
    else {
      piVar18 = *(pointer *)local_1a0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1df,(char *)piVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_298,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_298);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_248._0_8_ + 8))();
    }
  }
  uVar1 = local_1a0._8_8_;
  if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_1a0._8_8_ !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)*(pointer *)local_1a0._8_8_ !=
        &(((Settings *)(local_1a0._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_1a0._8_8_);
    }
    operator_delete((void *)uVar1);
  }
  local_248._0_4_ = 1;
  local_298.first.ht =
       (sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_298.first.ht._4_4_,
                   (this->
                   super_HashtableAllTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.key_info.super_Hasher.id_);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1a0,"1","this->ht_.key_eq().id()",(int *)local_248,(int *)&local_298)
  ;
  if (local_1a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        local_1a0._8_8_ ==
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      piVar18 = (pointer)0xafc493;
    }
    else {
      piVar18 = *(pointer *)local_1a0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1e1,(char *)piVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_298,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_298);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_248._0_8_ + 8))();
    }
  }
  uVar1 = local_1a0._8_8_;
  if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_1a0._8_8_ !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)*(pointer *)local_1a0._8_8_ !=
        &(((Settings *)(local_1a0._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_1a0._8_8_);
    }
    operator_delete((void *)uVar1);
  }
  local_248._0_8_ = local_248._0_8_ & 0xffffffff00000000;
  local_298.first.ht =
       (sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_298.first.ht._4_4_,local_e8.key_info.super_Hasher.id_);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1a0,"0","other_ht.key_eq().id()",(int *)local_248,(int *)&local_298);
  if (local_1a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        local_1a0._8_8_ ==
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      piVar18 = (pointer)0xafc493;
    }
    else {
      piVar18 = *(pointer *)local_1a0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1e2,(char *)piVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_298,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_298);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_248._0_8_ + 8))();
    }
  }
  uVar1 = local_1a0._8_8_;
  if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_1a0._8_8_ !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)*(pointer *)local_1a0._8_8_ !=
        &(((Settings *)(local_1a0._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_1a0._8_8_);
    }
    operator_delete((void *)uVar1);
  }
  local_248._0_8_ =
       *(size_type *)
        ((long)&(this->
                super_HashtableAllTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ).
                super_HashtableTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.
                super_BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.rep.table + 0x38);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_1a0,"expected_buckets","this->ht_.bucket_count()",
             (unsigned_long *)&local_108,(unsigned_long *)local_248);
  if (local_1a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        local_1a0._8_8_ ==
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      piVar18 = (pointer)0xafc493;
    }
    else {
      piVar18 = *(pointer *)local_1a0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1e4,(char *)piVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_298,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_298);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_248._0_8_ + 8))();
    }
  }
  uVar1 = local_1a0._8_8_;
  if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_1a0._8_8_ !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)*(pointer *)local_1a0._8_8_ !=
        &(((Settings *)(local_1a0._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_1a0._8_8_);
    }
    operator_delete((void *)uVar1);
  }
  local_248._0_8_ = local_e8.table.settings.table_size;
  local_298.first.ht =
       (sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_298.first.ht._4_4_,200);
  testing::internal::CmpHelperGT<unsigned_long,unsigned_int>
            ((internal *)local_1a0,"other_ht.bucket_count()","200u",(unsigned_long *)local_248,
             (uint *)&local_298);
  if (local_1a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        local_1a0._8_8_ ==
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      piVar18 = (pointer)0xafc493;
    }
    else {
      piVar18 = *(pointer *)local_1a0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1e5,(char *)piVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_298,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_298);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_248._0_8_ + 8))();
    }
  }
  uVar1 = local_1a0._8_8_;
  if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_1a0._8_8_ !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)*(pointer *)local_1a0._8_8_ !=
        &(((Settings *)(local_1a0._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_1a0._8_8_);
    }
    operator_delete((void *)uVar1);
  }
  local_298.first.ht =
       (sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_298.first.ht._4_4_,1);
  local_248._0_8_ =
       *(size_type *)
        ((long)&(this->
                super_HashtableAllTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ).
                super_HashtableTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.
                super_BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.rep.table + 0x40) -
       (this->
       super_HashtableAllTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.rep.num_deleted;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_1a0,"1u","this->ht_.size()",(uint *)&local_298,
             (unsigned_long *)local_248);
  if (local_1a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        local_1a0._8_8_ ==
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      piVar18 = (pointer)0xafc493;
    }
    else {
      piVar18 = *(pointer *)local_1a0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1e7,(char *)piVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_298,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_298);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_248._0_8_ + 8))();
    }
  }
  uVar1 = local_1a0._8_8_;
  if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_1a0._8_8_ !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)*(pointer *)local_1a0._8_8_ !=
        &(((Settings *)(local_1a0._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_1a0._8_8_);
    }
    operator_delete((void *)uVar1);
  }
  local_298.first.ht =
       (sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_298.first.ht._4_4_,0x7cc);
  local_248._0_8_ = local_e8.table.settings.num_buckets - local_e8.num_deleted;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_1a0,"1996u","other_ht.size()",(uint *)&local_298,
             (unsigned_long *)local_248);
  if (local_1a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        local_1a0._8_8_ ==
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      piVar18 = (pointer)0xafc493;
    }
    else {
      piVar18 = *(pointer *)local_1a0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1e8,(char *)piVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_298,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_298);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_248._0_8_ + 8))();
    }
  }
  uVar1 = local_1a0._8_8_;
  if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_1a0._8_8_ !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)*(pointer *)local_1a0._8_8_ !=
        &(((Settings *)(local_1a0._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_1a0._8_8_);
    }
    operator_delete((void *)uVar1);
  }
  local_298.first.ht =
       (sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)((ulong)local_298.first.ht & 0xffffffff00000000);
  local_1b0.id_ = UniqueObjectHelper<int>(0x6f);
  pVar20 = google::
           sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::find_position<int>(&this_00->rep,&local_1b0.id_);
  local_248._1_7_ = 0;
  local_248[0] = pVar20.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_1a0,"0u","this->ht_.count(this->UniqueKey(111))",(uint *)&local_298,
             (unsigned_long *)local_248);
  if (local_1a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        local_1a0._8_8_ ==
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      piVar18 = (pointer)0xafc493;
    }
    else {
      piVar18 = *(pointer *)local_1a0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1ea,(char *)piVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_298,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_298);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_248._0_8_ + 8))();
    }
  }
  uVar1 = local_1a0._8_8_;
  if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_1a0._8_8_ !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)*(pointer *)local_1a0._8_8_ !=
        &(((Settings *)(local_1a0._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_1a0._8_8_);
    }
    operator_delete((void *)uVar1);
  }
  local_298.first.ht =
       (sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_298.first.ht._4_4_,1);
  iVar13 = UniqueObjectHelper<int>(0x6f);
  local_1b0.id_ = iVar13;
  pVar20 = google::
           sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::find_position<int>(&local_e8,&local_1b0.id_);
  local_248._1_7_ = 0;
  local_248[0] = pVar20.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_1a0,"1u","other_ht.count(this->UniqueKey(111))",(uint *)&local_298,
             (unsigned_long *)local_248);
  if (local_1a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        local_1a0._8_8_ ==
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      piVar18 = (pointer)0xafc493;
    }
    else {
      piVar18 = *(pointer *)local_1a0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1eb,(char *)piVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_298,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_298);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_248._0_8_ + 8))();
    }
  }
  uVar1 = local_1a0._8_8_;
  if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_1a0._8_8_ !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)*(pointer *)local_1a0._8_8_ !=
        &(((Settings *)(local_1a0._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_1a0._8_8_);
    }
    operator_delete((void *)uVar1);
  }
  local_298.first.ht =
       (sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_298.first.ht._4_4_,1);
  iVar13 = UniqueObjectHelper<int>(0x7d1);
  local_1b0.id_ = iVar13;
  pVar20 = google::
           sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::find_position<int>(&this_00->rep,&local_1b0.id_);
  local_248._1_7_ = 0;
  local_248[0] = pVar20.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_1a0,"1u","this->ht_.count(this->UniqueKey(2001))",(uint *)&local_298,
             (unsigned_long *)local_248);
  if (local_1a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        local_1a0._8_8_ ==
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      piVar18 = (pointer)0xafc493;
    }
    else {
      piVar18 = *(pointer *)local_1a0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1ec,(char *)piVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_298,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_298);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_248._0_8_ + 8))();
    }
  }
  uVar1 = local_1a0._8_8_;
  if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_1a0._8_8_ !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)*(pointer *)local_1a0._8_8_ !=
        &(((Settings *)(local_1a0._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_1a0._8_8_);
    }
    operator_delete((void *)uVar1);
  }
  local_298.first.ht =
       (sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)((ulong)local_298.first.ht & 0xffffffff00000000);
  iVar13 = UniqueObjectHelper<int>(0x7d1);
  local_1b0.id_ = iVar13;
  pVar20 = google::
           sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::find_position<int>(&local_e8,&local_1b0.id_);
  local_248._1_7_ = 0;
  local_248[0] = pVar20.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_1a0,"0u","other_ht.count(this->UniqueKey(2001))",(uint *)&local_298,
             (unsigned_long *)local_248);
  if (local_1a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        local_1a0._8_8_ ==
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      piVar18 = (pointer)0xafc493;
    }
    else {
      piVar18 = *(pointer *)local_1a0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1ed,(char *)piVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_298,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_298);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_248._0_8_ + 8))();
    }
  }
  uVar1 = local_1a0._8_8_;
  if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_1a0._8_8_ !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)*(pointer *)local_1a0._8_8_ !=
        &(((Settings *)(local_1a0._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_1a0._8_8_);
    }
    operator_delete((void *)uVar1);
  }
  local_298.first.ht =
       (sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)((ulong)local_298.first.ht & 0xffffffff00000000);
  iVar13 = UniqueObjectHelper<int>(1000);
  local_1b0.id_ = iVar13;
  pVar20 = google::
           sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::find_position<int>(&this_00->rep,&local_1b0.id_);
  local_248._1_7_ = 0;
  local_248[0] = pVar20.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_1a0,"0u","this->ht_.count(this->UniqueKey(1000))",(uint *)&local_298,
             (unsigned_long *)local_248);
  if (local_1a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        local_1a0._8_8_ ==
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      piVar18 = (pointer)0xafc493;
    }
    else {
      piVar18 = *(pointer *)local_1a0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1ee,(char *)piVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_298,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_298);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_248._0_8_ + 8))();
    }
  }
  uVar1 = local_1a0._8_8_;
  if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_1a0._8_8_ !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)*(pointer *)local_1a0._8_8_ !=
        &(((Settings *)(local_1a0._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_1a0._8_8_);
    }
    operator_delete((void *)uVar1);
  }
  local_298.first.ht =
       (sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)((ulong)local_298.first.ht & 0xffffffff00000000);
  iVar13 = UniqueObjectHelper<int>(1000);
  local_1b0.id_ = iVar13;
  pVar20 = google::
           sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::find_position<int>(&local_e8,&local_1b0.id_);
  local_248._1_7_ = 0;
  local_248[0] = pVar20.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_1a0,"0u","other_ht.count(this->UniqueKey(1000))",(uint *)&local_298,
             (unsigned_long *)local_248);
  if (local_1a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        local_1a0._8_8_ ==
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      piVar18 = (pointer)0xafc493;
    }
    else {
      piVar18 = *(pointer *)local_1a0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1ef,(char *)piVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_298,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_298);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_248._0_8_ + 8))();
    }
  }
  uVar1 = local_1a0._8_8_;
  if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_1a0._8_8_ !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)*(pointer *)local_1a0._8_8_ !=
        &(((Settings *)(local_1a0._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_1a0._8_8_);
    }
    operator_delete((void *)uVar1);
  }
  google::
  sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::swap(&this_00->rep,&local_e8);
  iVar13 = UniqueObjectHelper<int>(1);
  local_248._0_4_ = iVar13;
  local_298.first.ht =
       (sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_298.first.ht._4_4_,
                   *(type *)((long)&(this->
                                    super_HashtableAllTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                    ).
                                    super_HashtableTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                    .ht_.
                                    super_BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                    .ht_.rep.key_info + 0xc));
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1a0,"this->UniqueKey(1)","this->ht_.deleted_key()",(int *)local_248,
             (int *)&local_298);
  if (local_1a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        local_1a0._8_8_ ==
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      piVar18 = (pointer)0xafc493;
    }
    else {
      piVar18 = *(pointer *)local_1a0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1fc,(char *)piVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_298,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_298);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_248._0_8_ + 8))();
    }
  }
  uVar1 = local_1a0._8_8_;
  if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_1a0._8_8_ !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)*(pointer *)local_1a0._8_8_ !=
        &(((Settings *)(local_1a0._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_1a0._8_8_);
    }
    operator_delete((void *)uVar1);
  }
  iVar13 = UniqueObjectHelper<int>(2);
  local_248._0_4_ = iVar13;
  local_298.first.ht =
       (sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_298.first.ht._4_4_,local_e8.key_info.delkey);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1a0,"this->UniqueKey(2)","other_ht.deleted_key()",(int *)local_248,
             (int *)&local_298);
  if (local_1a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        local_1a0._8_8_ ==
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      piVar18 = (pointer)0xafc493;
    }
    else {
      piVar18 = *(pointer *)local_1a0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1fd,(char *)piVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_298,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_298);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_248._0_8_ + 8))();
    }
  }
  uVar1 = local_1a0._8_8_;
  if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_1a0._8_8_ !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)*(pointer *)local_1a0._8_8_ !=
        &(((Settings *)(local_1a0._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_1a0._8_8_);
    }
    operator_delete((void *)uVar1);
  }
  local_248._0_8_ = local_248._0_8_ & 0xffffffff00000000;
  local_298.first.ht =
       (sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_298.first.ht._4_4_,
                   (this_00->rep).settings.
                   super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher.id_);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1a0,"0","this->ht_.hash_funct().id()",(int *)local_248,
             (int *)&local_298);
  if (local_1a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        local_1a0._8_8_ ==
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      piVar18 = (pointer)0xafc493;
    }
    else {
      piVar18 = *(pointer *)local_1a0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1fe,(char *)piVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_298,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_298);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_248._0_8_ + 8))();
    }
  }
  uVar1 = local_1a0._8_8_;
  if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_1a0._8_8_ !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)*(pointer *)local_1a0._8_8_ !=
        &(((Settings *)(local_1a0._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_1a0._8_8_);
    }
    operator_delete((void *)uVar1);
  }
  local_248._0_4_ = 1;
  local_298.first.ht =
       (sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_298.first.ht._4_4_,
                   local_e8.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
                   super_Hasher.id_);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1a0,"1","other_ht.hash_funct().id()",(int *)local_248,
             (int *)&local_298);
  if (local_1a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        local_1a0._8_8_ ==
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      piVar18 = (pointer)0xafc493;
    }
    else {
      piVar18 = *(pointer *)local_1a0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1ff,(char *)piVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_298,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_298);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_248._0_8_ + 8))();
    }
  }
  uVar1 = local_1a0._8_8_;
  if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_1a0._8_8_ !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)*(pointer *)local_1a0._8_8_ !=
        &(((Settings *)(local_1a0._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_1a0._8_8_);
    }
    operator_delete((void *)uVar1);
  }
  local_298.first.ht =
       (sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_298.first.ht._4_4_,0x7cc);
  local_248._0_8_ =
       *(size_type *)
        ((long)&(this->
                super_HashtableAllTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ).
                super_HashtableTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.
                super_BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.rep.table + 0x40) -
       (this->
       super_HashtableAllTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.rep.num_deleted;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_1a0,"1996u","this->ht_.size()",(uint *)&local_298,
             (unsigned_long *)local_248);
  if (local_1a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        local_1a0._8_8_ ==
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      piVar18 = (pointer)0xafc493;
    }
    else {
      piVar18 = *(pointer *)local_1a0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x200,(char *)piVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_298,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_298);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_248._0_8_ + 8))();
    }
  }
  uVar1 = local_1a0._8_8_;
  if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_1a0._8_8_ !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)*(pointer *)local_1a0._8_8_ !=
        &(((Settings *)(local_1a0._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_1a0._8_8_);
    }
    operator_delete((void *)uVar1);
  }
  local_298.first.ht =
       (sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_298.first.ht._4_4_,1);
  local_248._0_8_ = local_e8.table.settings.num_buckets - local_e8.num_deleted;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_1a0,"1u","other_ht.size()",(uint *)&local_298,
             (unsigned_long *)local_248);
  if (local_1a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        local_1a0._8_8_ ==
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      piVar18 = (pointer)0xafc493;
    }
    else {
      piVar18 = *(pointer *)local_1a0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x201,(char *)piVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_298,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_298);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_248._0_8_ + 8))();
    }
  }
  uVar1 = local_1a0._8_8_;
  if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_1a0._8_8_ !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)*(pointer *)local_1a0._8_8_ !=
        &(((Settings *)(local_1a0._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_1a0._8_8_);
    }
    operator_delete((void *)uVar1);
  }
  local_298.first.ht =
       (sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_298.first.ht._4_4_,1);
  iVar13 = UniqueObjectHelper<int>(0x6f);
  local_1b0.id_ = iVar13;
  pVar20 = google::
           sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::find_position<int>(&this_00->rep,&local_1b0.id_);
  local_248._1_7_ = 0;
  local_248[0] = pVar20.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_1a0,"1u","this->ht_.count(this->UniqueKey(111))",(uint *)&local_298,
             (unsigned_long *)local_248);
  if (local_1a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        local_1a0._8_8_ ==
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      piVar18 = (pointer)0xafc493;
    }
    else {
      piVar18 = *(pointer *)local_1a0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x202,(char *)piVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_298,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_298);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_248._0_8_ + 8))();
    }
  }
  uVar1 = local_1a0._8_8_;
  if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_1a0._8_8_ !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)*(pointer *)local_1a0._8_8_ !=
        &(((Settings *)(local_1a0._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_1a0._8_8_);
    }
    operator_delete((void *)uVar1);
  }
  local_298.first.ht =
       (sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)((ulong)local_298.first.ht & 0xffffffff00000000);
  iVar13 = UniqueObjectHelper<int>(0x6f);
  local_1b0.id_ = iVar13;
  pVar20 = google::
           sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::find_position<int>(&local_e8,&local_1b0.id_);
  local_248._1_7_ = 0;
  local_248[0] = pVar20.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_1a0,"0u","other_ht.count(this->UniqueKey(111))",(uint *)&local_298,
             (unsigned_long *)local_248);
  if (local_1a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        local_1a0._8_8_ ==
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      piVar18 = (pointer)0xafc493;
    }
    else {
      piVar18 = *(pointer *)local_1a0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x203,(char *)piVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_298,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_298);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_248._0_8_ + 8))();
    }
  }
  uVar1 = local_1a0._8_8_;
  if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_1a0._8_8_ !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)*(pointer *)local_1a0._8_8_ !=
        &(((Settings *)(local_1a0._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_1a0._8_8_);
    }
    operator_delete((void *)uVar1);
  }
  local_298.first.ht._0_4_ = 0;
  local_298.first.ht._4_4_ = 0;
  local_298.first.pos.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       ((ulong)local_298.first.pos.row_begin._M_current._4_4_ << 0x20);
  local_1b0.id_ = 0;
  local_1b0.num_hashes_ = 0;
  local_1b0.num_compares_ = 0;
  local_248._0_8_ = local_248._0_8_ & 0xffffffff00000000;
  local_248._8_8_ =
       (sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  this_01 = (sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             *)(local_1a0 + 8);
  local_1a0._0_8_ = &PTR__BaseHashtableInterface_00c22f88;
  google::
  sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable(this_01,0,(Hasher *)&local_298,&local_1b0,(Identity *)&local_fc,&local_299,
                     (Alloc<int,_unsigned_long,_18446744073709551615UL> *)local_248);
  local_1a0._0_8_ = &PTR__BaseHashtableInterface_00c22f08;
  iVar13 = UniqueObjectHelper<int>(1);
  google::
  sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(this_01);
  cStack_170._M_current._2_1_ = 1;
  uStack_160 = (const_nonempty_iterator)CONCAT44(iVar13,(undefined4)uStack_160);
  iVar13 = 2;
  do {
    local_298.first.ht._0_4_ = UniqueObjectHelper<int>(iVar13);
    google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::insert((pair<google::sparse_hashtable_const_iterator<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
              *)local_248,
             (sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)this_01,(value_type *)&local_298);
    iVar13 = iVar13 + 1;
  } while (iVar13 != 10000);
  local_1b0.id_ = 0;
  local_1b0.num_hashes_ = 0;
  local_1b0.num_compares_ = 0;
  local_fc.id_ = 0;
  local_fc.num_hashes_ = 0;
  local_fc.num_compares_ = 0;
  local_298.first.ht =
       (sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)((ulong)local_298.first.ht._4_4_ << 0x20);
  local_298.first.pos.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  local_248._0_8_ = &PTR__BaseHashtableInterface_00c22f88;
  google::
  sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable((sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)(local_248 + 8),0,&local_1b0,&local_fc,(Identity *)&local_299,&local_1a1,
                     (Alloc<int,_unsigned_long,_18446744073709551615UL> *)&local_298);
  uVar16 = local_118;
  cVar4._M_current = local_178;
  uVar12 = uStack_1b8;
  uVar14 = local_1c0;
  psVar11 = local_1f8.
            super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  psVar10 = local_1f8.
            super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  psVar9 = local_1f8.
           super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = _local_200;
  piVar7 = piStack_208;
  cVar6._M_current = local_210._M_current;
  cVar5._M_current = cStack_218._M_current;
  cVar3._M_current = local_220;
  cVar2._M_current = cStack_238._M_current;
  uVar1 = local_248._8_8_;
  local_248._0_8_ = &PTR__BaseHashtableInterface_00c22f08;
  local_298.first.pos.col_current = (const_nonempty_iterator)local_220;
  local_298.first.end.row_begin._M_current = cStack_218._M_current;
  local_298.first.pos.row_end._M_current = local_230._M_current;
  local_298.first.pos.row_current._M_current = psStack_228;
  local_298.first.ht =
       (sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)local_248._8_8_;
  local_298.first.pos.row_begin._M_current = cStack_238._M_current;
  local_220 = local_178;
  local_248._8_8_ = local_1a0._8_8_;
  cStack_238._M_current = cStack_190._M_current;
  local_178 = cVar3._M_current;
  local_1a0._8_8_ = uVar1;
  cStack_190._M_current = cVar2._M_current;
  local_210._M_current = local_168._M_current;
  piStack_208 = uStack_160;
  local_168._M_current = cVar6._M_current;
  uStack_160 = piVar7;
  local_200 = local_158;
  uStack_1ff = uStack_157;
  uVar1 = _local_200;
  local_200 = SUB81(uVar8,0);
  uStack_1ff = SUB87(uVar8,1);
  local_158 = local_200;
  uStack_157 = uStack_1ff;
  local_1f8.
  super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_150.
       super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_1f8.
  super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_150.
       super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1f8.
  super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_150.
       super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_150.
  super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ._M_impl.super__Vector_impl_data._M_start = psVar9;
  local_150.
  super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ._M_impl.super__Vector_impl_data._M_finish = psVar10;
  local_150.
  super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = psVar11;
  local_1c0 = local_118;
  uStack_1b8 = uStack_110;
  local_118 = uVar14;
  uStack_110 = uVar12;
  local_220._0_4_ = SUB84(cVar4._M_current,0);
  local_220._0_4_ = (float)local_220 * (float)uVar16;
  uVar15 = (ulong)(float)local_220;
  local_230._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       ((long)((float)local_220 - 9.223372e+18) & (long)uVar15 >> 0x3f | uVar15);
  local_220._4_4_ = (float)((ulong)cVar4._M_current >> 0x20);
  local_220._4_4_ = (float)uVar16 * local_220._4_4_;
  uVar16 = (ulong)local_220._4_4_;
  psStack_228 = (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                 *)((long)(local_220._4_4_ - 9.223372e+18) & (long)uVar16 >> 0x3f | uVar16);
  cStack_218._M_current = cStack_170._M_current & 0xffffffffffffff00;
  fVar19 = (float)uVar14;
  local_178._0_4_ = SUB84(cVar3._M_current,0);
  local_178._0_4_ = (float)local_178 * fVar19;
  uVar14 = (ulong)(float)local_178;
  local_188._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       ((long)((float)local_178 - 9.223372e+18) & (long)uVar14 >> 0x3f | uVar14);
  local_178._4_4_ = (float)((ulong)cVar3._M_current >> 0x20);
  fVar19 = fVar19 * local_178._4_4_;
  uVar14 = (ulong)fVar19;
  piStack_180 = (const_nonempty_iterator)
                ((long)(fVar19 - 9.223372e+18) & (long)uVar14 >> 0x3f | uVar14);
  cStack_170._M_current = cVar5._M_current & 0xffffffffffffff00;
  local_220 = cVar4._M_current;
  _local_200 = uVar1;
  local_178 = cVar3._M_current;
  iVar13 = UniqueObjectHelper<int>(1);
  google::
  sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(this_01);
  cStack_170._M_current._2_1_ = 1;
  uStack_160 = (const_nonempty_iterator)CONCAT44(iVar13,(undefined4)uStack_160);
  iVar13 = 2;
  do {
    iVar17 = UniqueObjectHelper<int>(iVar13);
    local_1b0.id_ = iVar17;
    google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::insert(&local_298,
             (sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)this_01,&local_1b0.id_);
    iVar13 = iVar13 + 1;
  } while (iVar13 != 10000);
  local_248._0_8_ = &PTR__BaseHashtableInterface_00c22f88;
  std::
  vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector(&local_1f8);
  local_1a0._0_8_ = &PTR__BaseHashtableInterface_00c22f88;
  std::
  vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector(&local_150);
  local_f0 = &PTR__BaseHashtableInterface_00c22f88;
  std::
  vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector(&local_e8.table.groups);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Swap) {
  // Let's make a second hashtable with its own hasher, key_equal, etc.
  typename TypeParam::hasher hasher(1);  // 1 is a unique id
  TypeParam other_ht(200, hasher, hasher);

  this->ht_.set_deleted_key(this->UniqueKey(1));
  other_ht.set_deleted_key(this->UniqueKey(2));

  for (int i = 3; i < 2000; i++) {
    this->ht_.insert(this->UniqueObject(i));
  }
  this->ht_.erase(this->UniqueKey(1000));
  other_ht.insert(this->UniqueObject(2001));
  typename TypeParam::size_type expected_buckets = other_ht.bucket_count();

  this->ht_.swap(other_ht);

  EXPECT_EQ(this->UniqueKey(2), this->ht_.deleted_key());
  EXPECT_EQ(this->UniqueKey(1), other_ht.deleted_key());

  EXPECT_EQ(1, this->ht_.hash_funct().id());
  EXPECT_EQ(0, other_ht.hash_funct().id());

  EXPECT_EQ(1, this->ht_.key_eq().id());
  EXPECT_EQ(0, other_ht.key_eq().id());

  EXPECT_EQ(expected_buckets, this->ht_.bucket_count());
  EXPECT_GT(other_ht.bucket_count(), 200u);

  EXPECT_EQ(1u, this->ht_.size());
  EXPECT_EQ(1996u, other_ht.size());  // because we erased 1000

  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(111)));
  EXPECT_EQ(1u, other_ht.count(this->UniqueKey(111)));
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(2001)));
  EXPECT_EQ(0u, other_ht.count(this->UniqueKey(2001)));
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(1000)));
  EXPECT_EQ(0u, other_ht.count(this->UniqueKey(1000)));

// We purposefully don't swap allocs -- they're not necessarily swappable.

// Now swap back, using the free-function swap
// NOTE: MSVC seems to have trouble with this free swap, not quite
// sure why.  I've given up trying to fix it though.
#ifdef _MSC_VER
  other_ht.swap(this->ht_);
#else
  swap(this->ht_, other_ht);
#endif

  EXPECT_EQ(this->UniqueKey(1), this->ht_.deleted_key());
  EXPECT_EQ(this->UniqueKey(2), other_ht.deleted_key());
  EXPECT_EQ(0, this->ht_.hash_funct().id());
  EXPECT_EQ(1, other_ht.hash_funct().id());
  EXPECT_EQ(1996u, this->ht_.size());
  EXPECT_EQ(1u, other_ht.size());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(111)));
  EXPECT_EQ(0u, other_ht.count(this->UniqueKey(111)));

  // A user reported a crash with this code using swap to clear.
  // We've since fixed the bug; this prevents a regression.
  TypeParam swap_to_clear_ht;
  swap_to_clear_ht.set_deleted_key(this->UniqueKey(1));
  for (int i = 2; i < 10000; ++i) {
    swap_to_clear_ht.insert(this->UniqueObject(i));
  }
  TypeParam empty_ht;
  empty_ht.swap(swap_to_clear_ht);
  swap_to_clear_ht.set_deleted_key(this->UniqueKey(1));
  for (int i = 2; i < 10000; ++i) {
    swap_to_clear_ht.insert(this->UniqueObject(i));
  }
}